

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::TryGetSafeCopy(LTFlightData *this,FDStaticData *outStat)

{
  bool bVar1;
  long in_RDI;
  system_error *e;
  unique_lock<std::recursive_mutex> lock;
  FDStaticData *in_stack_ffffffffffffff88;
  FDStaticData *in_stack_ffffffffffffff90;
  unique_lock<std::recursive_mutex> local_28 [2];
  byte local_1;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(local_28,in_RDI + 0x378);
  bVar1 = std::unique_lock::operator_cast_to_bool((unique_lock<std::recursive_mutex> *)0x1df595);
  if (bVar1) {
    FDStaticData::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_1 = 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff90);
  if (!bVar1) {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTFlightData::TryGetSafeCopy ( LTFlightData::FDStaticData& outStat ) const
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock);
        if ( lock )
        {
            // we got the lock, return a copy of the data
            outStat = statData;
            // Success!
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}